

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_agents.c
# Opt level: O1

REF_STATUS ref_agents_delete(REF_AGENTS ref_agents,REF_INT node)

{
  uint uVar1;
  long lVar2;
  REF_STATUS RVar3;
  long lVar4;
  
  if (node < 0) {
    RVar3 = 3;
  }
  else {
    if (0 < ref_agents->max) {
      lVar2 = 0x10;
      lVar4 = 0;
      do {
        if (((*(int *)((long)ref_agents->agent->xyz + lVar2 + -0x40) != 0) &&
            (*(int *)((long)ref_agents->agent->xyz + lVar2 + -0x30) == node)) &&
           (uVar1 = ref_agents_remove(ref_agents,(REF_INT)lVar4), uVar1 != 0)) {
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_agents.c",
                 0xe8,"ref_agents_delete",(ulong)uVar1,"rm");
          return uVar1;
        }
        lVar4 = lVar4 + 1;
        lVar2 = lVar2 + 0x68;
      } while (lVar4 < ref_agents->max);
    }
    RVar3 = 0;
  }
  return RVar3;
}

Assistant:

REF_FCN REF_STATUS ref_agents_delete(REF_AGENTS ref_agents, REF_INT node) {
  REF_INT id;

  if (node < 0) return REF_INVALID;

  each_active_ref_agent(ref_agents, id) {
    if (node == ref_agent_node(ref_agents, id))
      RSS(ref_agents_remove(ref_agents, id), "rm");
  }

  return REF_SUCCESS;
}